

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::ES3Checker::check
          (ES3Checker *this,GLenum attPoint,Attachment *att,Image *image)

{
  GLsizei GVar1;
  int iVar2;
  GLenum GVar3;
  GLenum GVar4;
  
  GVar1 = deqp::gls::FboUtil::config::imageNumSamples(image);
  iVar2 = this->m_numSamples;
  if (iVar2 == -1) {
    this->m_numSamples = GVar1;
  }
  else {
    if ((GVar1 != 0) == (iVar2 == 0)) {
      deqp::gls::FboUtil::Checker::addFBOStatus
                (&this->super_Checker,0x8d56,"Mixed multi- and single-sampled attachments");
      iVar2 = this->m_numSamples;
    }
    if (iVar2 != GVar1) {
      deqp::gls::FboUtil::Checker::addPotentialFBOStatus
                (&this->super_Checker,0x8d56,"Number of samples differ");
    }
  }
  if ((attPoint & 0xffffffdf) == 0x8d00) {
    if (this->m_depthStencilImage != 0) {
      if ((this->m_depthStencilImage == att->imageName) &&
         (GVar4 = this->m_depthStencilType, GVar3 = deqp::gls::FboUtil::config::attachmentType(att),
         GVar4 == GVar3)) {
        return;
      }
      deqp::gls::FboUtil::Checker::addFBOStatus
                (&this->super_Checker,0x8cdd,"Depth and stencil attachments are not the same image")
      ;
      return;
    }
    this->m_depthStencilImage = att->imageName;
    GVar4 = deqp::gls::FboUtil::config::attachmentType(att);
    this->m_depthStencilType = GVar4;
  }
  return;
}

Assistant:

void ES3Checker::check (GLenum attPoint, const Attachment& att, const Image* image)
{
	GLsizei imgSamples = imageNumSamples(*image);

	if (m_numSamples == -1)
	{
		m_numSamples = imgSamples;
	}
	else
	{
		// GLES3: "The value of RENDERBUFFER_SAMPLES is the same for all attached
		// renderbuffers and, if the attached images are a mix of renderbuffers
		// and textures, the value of RENDERBUFFER_SAMPLES is zero."
		//
		// On creating a renderbuffer: "If _samples_ is zero, then
		// RENDERBUFFER_SAMPLES is set to zero. Otherwise [...] the resulting
		// value for RENDERBUFFER_SAMPLES is guaranteed to be greater than or
		// equal to _samples_ and no more than the next larger sample count
		// supported by the implementation."

		// Either all attachments are zero-sample renderbuffers and/or
		// textures, or none of them are.
		if ((m_numSamples == 0) != (imgSamples == 0))
			addFBOStatus(GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE, "Mixed multi- and single-sampled attachments");

		// If the attachments requested a different number of samples, the
		// implementation is allowed to report this as incomplete. However, it
		// is also possible that despite the different requests, the
		// implementation allocated the same number of samples to both. Hence
		// reporting the framebuffer as complete is also legal.
		if (m_numSamples != imgSamples)
			addPotentialFBOStatus(GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE, "Number of samples differ");
	}

	// "Depth and stencil attachments, if present, are the same image."
	if (attPoint == GL_DEPTH_ATTACHMENT || attPoint == GL_STENCIL_ATTACHMENT)
	{
		if (m_depthStencilImage == 0)
		{
			m_depthStencilImage = att.imageName;
			m_depthStencilType = attachmentType(att);
		}
		else
		{
			if (m_depthStencilImage != att.imageName || m_depthStencilType != attachmentType(att))
				addFBOStatus(GL_FRAMEBUFFER_UNSUPPORTED, "Depth and stencil attachments are not the same image");
		}
	}
}